

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

string * __thiscall
Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getParamType(Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  string *in_RDI;
  
  ParameterTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::getParamType();
  return in_RDI;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }